

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastErR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int value;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 data_00;
  ParseContext *ctx_00;
  ushort *puVar7;
  uint *puVar8;
  RepeatedField<int> *this;
  int iVar9;
  
  if (data.field_0._0_2_ != 0) {
    pcVar6 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  this = (RepeatedField<int> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  uVar2 = *(ushort *)ptr;
  data_00.data = (ulong)data.field_0 >> 0x18 & 0xff;
  uVar4 = *(uint *)((long)&table->has_bits_offset + data_00.data * 8 + (ulong)table->aux_offset);
  iVar9 = (int)(short)uVar4;
  do {
    uVar5 = (ulong)(char)*(ushort *)((long)ptr + 2);
    if ((long)uVar5 < 0) {
      data_00.data = (long)*(char *)((long)ptr + 3) << 7 | 0x7f;
      if ((long)data_00 < 0) {
        ctx_00 = (ParseContext *)((long)(char)*(ushort *)((long)ptr + 4) << 0xe | 0x3fff);
        if ((long)ctx_00 < 0) {
          data_00.data = data_00.data & ((long)*(char *)((long)ptr + 5) << 0x15 | 0x1fffffU);
          if ((long)data_00 < 0) {
            ctx_00 = (ParseContext *)
                     ((ulong)ctx_00 & ((long)(char)*(ushort *)((long)ptr + 6) << 0x1c | 0xfffffffU))
            ;
            if ((long)ctx_00 < 0) {
              data_00.data = data_00.data & ((long)*(char *)((long)ptr + 7) << 0x23 | 0x7ffffffffU);
              if ((long)data_00 < 0) {
                ctx_00 = (ParseContext *)
                         ((ulong)ctx_00 &
                         ((long)(char)*(ushort *)((long)ptr + 8) << 0x2a | 0x3ffffffffffU));
                if ((long)ctx_00 < 0) {
                  data_00.data = data_00.data &
                                 ((long)*(char *)((long)ptr + 9) << 0x31 | 0x1ffffffffffffU);
                  if ((long)data_00 < 0) {
                    ctx_00 = (ParseContext *)
                             ((ulong)ctx_00 &
                             ((ulong)(byte)*(ushort *)((long)ptr + 10) << 0x38 | 0xffffffffffffff));
                    if ((long)ctx_00 < 0) {
                      puVar7 = (ushort *)((long)ptr + 0xc);
                      bVar1 = *(byte *)((long)ptr + 0xb);
                      if (bVar1 != 1) {
                        if ((char)bVar1 < '\0') {
                          pcVar6 = Error(msg,ptr,ctx_00,(TcFieldData)data_00,table,hasbits);
                          return pcVar6;
                        }
                        if ((bVar1 & 1) == 0) {
                          ctx_00 = (ParseContext *)((ulong)ctx_00 ^ 0x8000000000000000);
                        }
                      }
                    }
                    else {
                      puVar7 = (ushort *)((long)ptr + 0xb);
                    }
                  }
                  else {
                    puVar7 = (ushort *)((long)ptr + 10);
                  }
                }
                else {
                  puVar7 = (ushort *)((long)ptr + 9);
                }
              }
              else {
                puVar7 = (ushort *)((long)ptr + 8);
              }
            }
            else {
              puVar7 = (ushort *)((long)ptr + 7);
            }
          }
          else {
            puVar7 = (ushort *)((long)ptr + 6);
          }
        }
        else {
          puVar7 = (ushort *)((long)ptr + 5);
        }
        data_00.data = data_00.data & (ulong)ctx_00;
      }
      else {
        puVar7 = (ushort *)((long)ptr + 4);
      }
      uVar5 = uVar5 & data_00.data;
    }
    else {
      puVar7 = (ushort *)((long)ptr + 3);
    }
    value = (int)uVar5;
    if ((value < iVar9) || ((int)((uVar4 >> 0x10) + iVar9) <= value)) {
      pcVar6 = FastUnknownEnumFallback(msg,ptr,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar6;
    }
    RepeatedField<int>::Add(this,value);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar7) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar8 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar8 & 3) != 0) {
          AlignFail();
        }
        *puVar8 = *puVar8 | (uint)hasbits;
      }
      return (char *)puVar7;
    }
    uVar3 = *puVar7;
    data_00.data._2_6_ = 0;
    data_00.data._0_2_ = uVar3;
    ptr = (char *)puVar7;
  } while (uVar3 == uVar2);
  uVar4 = (uint)table->fast_idx_mask & (uint)uVar3;
  if ((uVar4 & 7) == 0) {
    uVar5 = (ulong)(uVar4 & 0xfffffff8);
    pcVar6 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                               (msg,puVar7,ctx,
                                data_00.data ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2),table
                                ,hasbits);
    return pcVar6;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastErR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnum<uint16_t, field_layout::kTvRange>(
      PROTOBUF_TC_PARAM_PASS);
}